

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O2

void __thiscall
deci::ast_postfix_t::ast_postfix_t(ast_postfix_t *this,string *identifier,ast_arg_list_t *arglist)

{
  (this->super_ast_item_t).parent = (ast_item_t *)0x0;
  (this->super_ast_item_t)._vptr_ast_item_t = (_func_int **)&PTR_EndLocationTag_abi_cxx11__0011d4f0;
  this->arglist = arglist;
  std::__cxx11::string::string((string *)&this->identifier,(string *)identifier);
  return;
}

Assistant:

ast_postfix_t::ast_postfix_t(const std::string& identifier, ast_arg_list_t* arglist)
    :arglist(arglist), identifier(identifier) {
      ;
  }